

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

bool __thiscall slang::parsing::Token::isOnSameLine(Token *this)

{
  TriviaKind TVar1;
  SyntaxNode *pSVar2;
  size_type sVar3;
  string_view local_60;
  undefined8 local_50;
  size_t offset;
  Trivia *t;
  iterator __end2;
  iterator __begin2;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *local_20;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> *__range2;
  Token *this_local;
  
  __range2 = (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)this;
  ___begin2 = trivia(this);
  local_20 = (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)&__begin2;
  __end2 = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::begin
                     (local_20);
  t = nonstd::span_lite::span<const_slang::parsing::Trivia,_18446744073709551615UL>::end(local_20);
  do {
    if (__end2 == t) {
      return true;
    }
    offset = (size_t)__end2;
    TVar1 = __end2->kind;
    if ((byte)(TVar1 - EndOfLine) < 2) {
      return false;
    }
    if (TVar1 == BlockComment) {
      local_60 = Trivia::getRawText(__end2);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                        (&local_60,"\r\n",0);
      if (sVar3 != 0xffffffffffffffff) {
        return false;
      }
      local_50 = 0xffffffffffffffff;
    }
    else {
      if ((byte)(TVar1 - DisabledText) < 3) {
        return false;
      }
      if ((TVar1 == Directive) && (pSVar2 = Trivia::syntax(__end2), pSVar2->kind != MacroUsage)) {
        return false;
      }
    }
    __end2 = __end2 + 1;
  } while( true );
}

Assistant:

bool Token::isOnSameLine() const {
    for (auto& t : trivia()) {
        switch (t.kind) {
            case TriviaKind::LineComment:
            case TriviaKind::EndOfLine:
            case TriviaKind::SkippedSyntax:
            case TriviaKind::SkippedTokens:
            case TriviaKind::DisabledText:
                return false;
            case TriviaKind::Directive:
                if (t.syntax()->kind != SyntaxKind::MacroUsage)
                    return false;
                break;
            case TriviaKind::BlockComment:
                if (size_t offset = t.getRawText().find_first_of("\r\n");
                    offset != std::string_view::npos) {
                    return false;
                }
                break;
            default:
                break;
        }
    }
    return true;
}